

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O1

void __thiscall Assimp::glTF2Importer::ImportMeshes(glTF2Importer *this,Asset *r)

{
  ulong uVar1;
  pointer *ppuVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  PrimitiveMode PVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  iterator iVar13;
  aiVector3D *paVar14;
  vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *pvVar15;
  vector<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_> *pvVar16;
  BufferView *pBVar17;
  vector<glTF2::Buffer_*,_std::allocator<glTF2::Buffer_*>_> *pvVar18;
  long lVar19;
  aiScene *paVar20;
  bool bVar21;
  glTF2Importer *pgVar22;
  iterator iVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  pointer ppMVar28;
  aiMesh *paVar29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar30;
  aiVector3D *paVar31;
  pointer pRVar32;
  float *pfVar33;
  Logger *pLVar34;
  long *plVar35;
  aiAnimMesh **ppaVar36;
  aiAnimMesh *paVar37;
  Accessor *pAVar38;
  ulong *puVar39;
  aiFace *paVar40;
  uint **ppuVar41;
  uint *puVar42;
  undefined8 *puVar43;
  undefined4 *puVar44;
  aiMesh **ppaVar45;
  int iVar46;
  long lVar47;
  ulong uVar48;
  _func_int **pp_Var49;
  ulong uVar50;
  ulong uVar51;
  int iVar52;
  char *pcVar53;
  char *pcVar54;
  ulong *puVar55;
  aiMesh **ppaVar56;
  ulong uVar57;
  ulong uVar58;
  uint uVar59;
  size_t *psVar60;
  pointer pPVar61;
  aiFace *paVar62;
  bool bVar63;
  aiMesh *aim;
  Tangent *tangents;
  uint k;
  aiVector3D *tangentDiff;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  ulong local_f8;
  aiMesh *local_f0;
  ulong local_e8;
  pointer local_e0;
  ulong local_d8;
  ulong local_d0;
  Indexer local_c8;
  uint local_a4;
  aiFace *local_a0;
  Mesh *local_98;
  glTF2Importer *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  aiMesh **local_68;
  iterator iStack_60;
  aiMesh **local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_48;
  Asset *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  local_68 = (aiMesh **)0x0;
  iStack_60._M_current = (aiMesh **)0x0;
  local_58 = (aiMesh **)0x0;
  local_a4 = 0;
  ppMVar28 = (r->meshes).mObjs.super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_90 = this;
  local_40 = r;
  if (((long)(r->meshes).mObjs.super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>.
             _M_impl.super__Vector_impl_data._M_finish - (long)ppMVar28 & 0x7fffffff8U) != 0) {
    local_48 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&this->meshOffsets;
    uVar50 = 0;
    do {
      local_98 = ppMVar28[uVar50];
      iVar13._M_current =
           (local_90->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar13._M_current ==
          (local_90->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(local_48,iVar13,&local_a4);
      }
      else {
        *iVar13._M_current = local_a4;
        ppuVar2 = &(local_90->meshOffsets).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar2 = *ppuVar2 + 1;
      }
      local_a4 = local_a4 +
                 (int)((ulong)((long)*(pointer *)
                                      ((long)&(local_98->primitives).
                                              super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                                              ._M_impl + 8) -
                              *(long *)&(local_98->primitives).
                                        super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                                        ._M_impl.super__Vector_impl_data) >> 8);
      pPVar61 = (local_98->primitives).
                super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&(local_98->primitives).
                   super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                   ._M_impl + 8) != pPVar61) {
        local_50 = &(local_98->super_Object).name;
        local_38 = &(local_98->super_Object).id;
        local_f8 = 0;
        local_e8 = uVar50;
        do {
          psVar60 = &local_c8.elemSize;
          paVar29 = (aiMesh *)operator_new(0x520);
          paVar29->mPrimitiveTypes = 0;
          paVar29->mNumVertices = 0;
          paVar29->mNumFaces = 0;
          memset(&paVar29->mVertices,0,0xcc);
          paVar29->mBones = (aiBone **)0x0;
          paVar29->mMaterialIndex = 0;
          (paVar29->mName).length = 0;
          (paVar29->mName).data[0] = '\0';
          memset((paVar29->mName).data + 1,0x1b,0x3ff);
          paVar29->mNumAnimMeshes = 0;
          paVar29->mAnimMeshes = (aiAnimMesh **)0x0;
          paVar29->mMethod = 0;
          (paVar29->mAABB).mMin.x = 0.0;
          (paVar29->mAABB).mMin.y = 0.0;
          (paVar29->mAABB).mMin.z = 0.0;
          (paVar29->mAABB).mMax.x = 0.0;
          (paVar29->mAABB).mMax.y = 0.0;
          (paVar29->mAABB).mMax.z = 0.0;
          paVar29->mTextureCoords[0] = (aiVector3D *)0x0;
          paVar29->mTextureCoords[1] = (aiVector3D *)0x0;
          paVar29->mTextureCoords[2] = (aiVector3D *)0x0;
          paVar29->mTextureCoords[3] = (aiVector3D *)0x0;
          paVar29->mTextureCoords[4] = (aiVector3D *)0x0;
          paVar29->mTextureCoords[5] = (aiVector3D *)0x0;
          paVar29->mTextureCoords[6] = (aiVector3D *)0x0;
          paVar29->mTextureCoords[7] = (aiVector3D *)0x0;
          paVar29->mNumUVComponents[0] = 0;
          paVar29->mNumUVComponents[1] = 0;
          paVar29->mNumUVComponents[2] = 0;
          paVar29->mNumUVComponents[3] = 0;
          paVar29->mNumUVComponents[4] = 0;
          paVar29->mNumUVComponents[5] = 0;
          paVar29->mNumUVComponents[6] = 0;
          paVar29->mNumUVComponents[7] = 0;
          paVar29->mColors[0] = (aiColor4D *)0x0;
          paVar29->mColors[1] = (aiColor4D *)0x0;
          paVar29->mColors[2] = (aiColor4D *)0x0;
          paVar29->mColors[3] = (aiColor4D *)0x0;
          paVar29->mColors[4] = (aiColor4D *)0x0;
          paVar29->mColors[5] = (aiColor4D *)0x0;
          paVar29->mColors[6] = (aiColor4D *)0x0;
          paVar29->mColors[7] = (aiColor4D *)0x0;
          local_f0 = paVar29;
          if (iStack_60._M_current == local_58) {
            std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                      ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_68,iStack_60,&local_f0);
          }
          else {
            *iStack_60._M_current = paVar29;
            iStack_60._M_current = iStack_60._M_current + 1;
          }
          paVar29 = local_f0;
          pbVar30 = local_50;
          if ((local_98->super_Object).name._M_string_length == 0) {
            pbVar30 = local_38;
          }
          uVar50 = pbVar30->_M_string_length;
          if (uVar50 < 0x400) {
            (local_f0->mName).length = (ai_uint32)uVar50;
            memcpy((local_f0->mName).data,(pbVar30->_M_dataplus)._M_p,uVar50);
            (paVar29->mName).data[uVar50] = '\0';
          }
          iVar46 = (int)local_f8;
          if (0x100 < (ulong)((long)*(pointer *)
                                     ((long)&(local_98->primitives).
                                             super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                                             ._M_impl + 8) -
                             *(long *)&(local_98->primitives).
                                       super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                                       ._M_impl.super__Vector_impl_data)) {
            uVar24 = (local_f0->mName).length;
            (local_f0->mName).data[uVar24] = '-';
            pcVar53 = (local_f0->mName).data + (ulong)uVar24 + 1;
            uVar59 = 1;
            uVar50 = local_f8;
            if ((iVar46 < 0) && (1 < 0x3ff - uVar24)) {
              (local_f0->mName).data[(ulong)uVar24 + 1] = '-';
              pcVar53 = (local_f0->mName).data + (ulong)uVar24 + 2;
              uVar50 = (ulong)(uint)-iVar46;
              uVar59 = 2;
            }
            iVar52 = 1000000000;
            bVar63 = false;
            do {
              pcVar54 = pcVar53;
              if (0x3ff - uVar24 <= uVar59) break;
              lVar47 = (long)(int)uVar50 / (long)iVar52;
              uVar48 = (long)(int)uVar50 % (long)iVar52 & 0xffffffff;
              if (((bVar63) || (iVar52 == 1)) || ((int)lVar47 != 0)) {
                pcVar54 = pcVar53 + 1;
                uVar59 = uVar59 + 1;
                *pcVar53 = (char)lVar47 + '0';
                bVar63 = true;
                uVar50 = uVar48;
                pcVar53 = pcVar54;
                if (iVar52 != 1) goto LAB_005f70bf;
                bVar21 = false;
                iVar52 = 1;
              }
              else {
LAB_005f70bf:
                iVar52 = iVar52 / 10;
                bVar21 = true;
                pcVar54 = pcVar53;
              }
              pcVar53 = pcVar54;
            } while (bVar21);
            *pcVar54 = '\0';
            (local_f0->mName).length = (local_f0->mName).length + uVar59;
          }
          local_e0 = pPVar61 + local_f8;
          PVar10 = local_e0->mode;
          if (PVar10 - PrimitiveMode_LINES < 3) {
            uVar24 = 2;
LAB_005f7128:
            local_f0->mPrimitiveTypes = local_f0->mPrimitiveTypes | uVar24;
          }
          else {
            if (PVar10 - PrimitiveMode_TRIANGLES < 3) {
              uVar24 = 4;
              goto LAB_005f7128;
            }
            uVar24 = 1;
            if (PVar10 == PrimitiveMode_POINTS) goto LAB_005f7128;
          }
          pRVar32 = *(pointer *)
                     &(local_e0->attributes).position.
                      super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                      ._M_impl;
          if ((*(pointer *)
                ((long)&(local_e0->attributes).position.
                        super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                + 8) != pRVar32) &&
             (pRVar32->vector !=
              (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0)) {
            local_f0->mNumVertices =
                 *(uint *)(*(long *)(*(long *)&(pRVar32->vector->
                                               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                                               )._M_impl + (ulong)pRVar32->index * 8) + 0x70);
            puVar43 = *(undefined8 **)
                       &(local_e0->attributes).position.
                        super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                        ._M_impl;
            glTF2::Accessor::ExtractData<aiVector3t<float>>
                      (*(Accessor **)(*(long *)*puVar43 + (ulong)*(uint *)(puVar43 + 1) * 8),
                       &local_f0->mVertices);
          }
          pRVar32 = (local_e0->attributes).normal.
                    super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((*(pointer *)
                ((long)&(local_e0->attributes).normal.
                        super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                + 8) != pRVar32) &&
             (pRVar32->vector !=
              (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0)) {
            glTF2::Accessor::ExtractData<aiVector3t<float>>
                      (*(Accessor **)
                        (*(long *)&(pRVar32->vector->
                                   super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                                   )._M_impl + (ulong)pRVar32->index * 8),&local_f0->mNormals);
            pRVar32 = (local_e0->attributes).tangent.
                      super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((*(pointer *)
                  ((long)&(local_e0->attributes).tangent.
                          super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                  + 8) != pRVar32) &&
               (pRVar32->vector !=
                (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0)) {
              local_c8.accessor = (Accessor *)0x0;
              glTF2::Accessor::ExtractData<(anonymous_namespace)::Tangent>
                        (*(Accessor **)
                          (*(long *)&(pRVar32->vector->
                                     super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                                     )._M_impl + (ulong)pRVar32->index * 8),(Tangent **)&local_c8);
              paVar29 = local_f0;
              uVar50 = (ulong)local_f0->mNumVertices;
              paVar31 = (aiVector3D *)operator_new__(uVar50 * 0xc);
              if (uVar50 != 0) {
                memset(paVar31,0,((uVar50 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
              }
              paVar29->mTangents = paVar31;
              uVar50 = (ulong)paVar29->mNumVertices;
              paVar31 = (aiVector3D *)operator_new__(uVar50 * 0xc);
              if (uVar50 != 0) {
                memset(paVar31,0,((uVar50 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
              }
              paVar29->mBitangents = paVar31;
              if (local_f0->mNumVertices != 0) {
                lVar47 = 0;
                uVar50 = 0;
                pAVar38 = local_c8.accessor;
                do {
                  paVar31 = local_f0->mTangents;
                  *(int *)((long)&paVar31->z + lVar47) =
                       (int)*(size_t *)&(pAVar38->super_Object).index;
                  *(_func_int ***)((long)&paVar31->x + lVar47) =
                       (pAVar38->super_Object)._vptr_Object;
                  paVar31 = local_f0->mNormals;
                  paVar14 = local_f0->mBitangents;
                  fVar3 = *(float *)((long)&paVar31->x + lVar47);
                  fVar4 = *(float *)((long)&paVar31->y + lVar47);
                  fVar5 = (float)(pAVar38->super_Object).index;
                  fVar6 = *(float *)((long)&paVar31->z + lVar47);
                  fVar7 = *(float *)&(pAVar38->super_Object)._vptr_Object;
                  fVar8 = *(float *)((long)&(pAVar38->super_Object)._vptr_Object + 4);
                  fVar9 = (float)(pAVar38->super_Object).oIndex;
                  *(ulong *)((long)&paVar14->x + lVar47) =
                       CONCAT44((fVar6 * fVar7 - fVar5 * fVar3) * fVar9,
                                (fVar4 * fVar5 - fVar8 * fVar6) * fVar9);
                  *(float *)((long)&paVar14->z + lVar47) = (fVar3 * fVar8 - fVar7 * fVar4) * fVar9;
                  uVar50 = uVar50 + 1;
                  pAVar38 = (Accessor *)&(pAVar38->super_Object).id;
                  lVar47 = lVar47 + 0xc;
                } while (uVar50 < local_f0->mNumVertices);
              }
              if (local_c8.accessor != (Accessor *)0x0) {
                operator_delete__(local_c8.accessor);
              }
            }
          }
          pRVar32 = (local_e0->attributes).color.
                    super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (*(pointer *)
               ((long)&(local_e0->attributes).color.
                       super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
               + 8) != pRVar32) {
            lVar47 = 0x30;
            uVar50 = 0;
            do {
              pAVar38 = *(Accessor **)
                         (**(long **)((long)&pRVar32[-6].vector + lVar47 * 2) +
                         (ulong)*(uint *)((long)pRVar32 + lVar47 * 2 + -0x58) * 8);
              if (pAVar38->count == (ulong)local_f0->mNumVertices) {
                glTF2::Accessor::ExtractData<aiColor4t<float>>
                          (pAVar38,(aiColor4t<float> **)((long)local_f0->mColors + lVar47 + -0x30));
              }
              else {
                pLVar34 = DefaultLogger::get();
                std::operator+(&local_88,"Color stream size in mesh \"",local_50);
                plVar35 = (long *)std::__cxx11::string::append((char *)&local_88);
                pAVar38 = (Accessor *)(plVar35 + 2);
                if ((Accessor *)*plVar35 == pAVar38) {
                  local_c8.elemSize = (size_t)(pAVar38->super_Object)._vptr_Object;
                  local_c8.stride = plVar35[3];
                  local_c8.accessor = (Accessor *)psVar60;
                }
                else {
                  local_c8.elemSize = (size_t)(pAVar38->super_Object)._vptr_Object;
                  local_c8.accessor = (Accessor *)*plVar35;
                }
                local_c8.data = (uint8_t *)plVar35[1];
                *plVar35 = (long)pAVar38;
                plVar35[1] = 0;
                *(undefined1 *)(plVar35 + 2) = 0;
                Logger::warn(pLVar34,(char *)local_c8.accessor);
                if (local_c8.accessor != (Accessor *)psVar60) {
                  operator_delete(local_c8.accessor,local_c8.elemSize + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_88._M_dataplus._M_p != &local_88.field_2) {
                  operator_delete(local_88._M_dataplus._M_p,
                                  local_88.field_2._M_allocated_capacity + 1);
                }
              }
              if (6 < uVar50) break;
              uVar50 = uVar50 + 1;
              pRVar32 = (local_e0->attributes).color.
                        super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar47 = lVar47 + 8;
            } while (uVar50 < (ulong)((long)*(pointer *)
                                             ((long)&(local_e0->attributes).color.
                                                                                                          
                                                  super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                             + 8) - (long)pRVar32 >> 4));
          }
          pRVar32 = (local_e0->attributes).texcoord.
                    super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (*(pointer *)
               ((long)&(local_e0->attributes).texcoord.
                       super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
               + 8) != pRVar32) {
            uVar50 = 0;
            do {
              pAVar38 = *(Accessor **)
                         (*(long *)&((pRVar32[uVar50].vector)->
                                    super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                                    )._M_impl + (ulong)pRVar32[uVar50].index * 8);
              if (pAVar38->count == (ulong)local_f0->mNumVertices) {
                glTF2::Accessor::ExtractData<aiVector3t<float>>
                          (pAVar38,local_f0->mTextureCoords + uVar50);
                lVar47 = *(long *)&(local_e0->attributes).texcoord.
                                   super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                   ._M_impl.super__Vector_impl_data;
                local_f0->mNumUVComponents[uVar50] =
                     *(uint *)(&DAT_008cf328 +
                              (ulong)*(uint *)(*(long *)(**(long **)(lVar47 + uVar50 * 0x10) +
                                                        (ulong)*(uint *)(lVar47 + 8 + uVar50 * 0x10)
                                                        * 8) + 0x78) * 0x10);
                if (local_f0->mNumVertices != 0) {
                  pfVar33 = &local_f0->mTextureCoords[uVar50]->y;
                  uVar48 = 0;
                  do {
                    *pfVar33 = 1.0 - *pfVar33;
                    uVar48 = uVar48 + 1;
                    pfVar33 = pfVar33 + 3;
                  } while (uVar48 < local_f0->mNumVertices);
                }
              }
              else {
                pLVar34 = DefaultLogger::get();
                std::operator+(&local_88,"Texcoord stream size in mesh \"",local_50);
                plVar35 = (long *)std::__cxx11::string::append((char *)&local_88);
                pAVar38 = (Accessor *)(plVar35 + 2);
                if ((Accessor *)*plVar35 == pAVar38) {
                  local_c8.elemSize = (size_t)(pAVar38->super_Object)._vptr_Object;
                  local_c8.stride = plVar35[3];
                  local_c8.accessor = (Accessor *)psVar60;
                }
                else {
                  local_c8.elemSize = (size_t)(pAVar38->super_Object)._vptr_Object;
                  local_c8.accessor = (Accessor *)*plVar35;
                }
                local_c8.data = (uint8_t *)plVar35[1];
                *plVar35 = (long)pAVar38;
                plVar35[1] = 0;
                *(undefined1 *)(plVar35 + 2) = 0;
                Logger::warn(pLVar34,(char *)local_c8.accessor);
                if (local_c8.accessor != (Accessor *)psVar60) {
                  operator_delete(local_c8.accessor,local_c8.elemSize + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_88._M_dataplus._M_p != &local_88.field_2) {
                  operator_delete(local_88._M_dataplus._M_p,
                                  local_88.field_2._M_allocated_capacity + 1);
                }
              }
              if (6 < uVar50) break;
              uVar50 = uVar50 + 1;
              pRVar32 = (local_e0->attributes).texcoord.
                        super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar50 < (ulong)((long)*(pointer *)
                                             ((long)&(local_e0->attributes).texcoord.
                                                                                                          
                                                  super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                             + 8) - (long)pRVar32 >> 4));
          }
          uVar50 = local_e8;
          paVar29 = local_f0;
          lVar47 = (long)*(pointer *)
                          ((long)&(local_e0->targets).
                                  super__Vector_base<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                                  ._M_impl + 8) -
                   *(long *)&(local_e0->targets).
                             super__Vector_base<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                             ._M_impl.super__Vector_impl_data;
          if (lVar47 != 0) {
            lVar47 = lVar47 >> 3;
            local_f0->mNumAnimMeshes = (int)lVar47 * 0x38e38e39;
            ppaVar36 = (aiAnimMesh **)operator_new__(lVar47 * 0x71c71c71c71c71c8 & 0x7fffffff8);
            paVar29->mAnimMeshes = ppaVar36;
            if (*(pointer *)
                 ((long)&(local_e0->targets).
                         super__Vector_base<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                         ._M_impl + 8) !=
                (local_e0->targets).
                super__Vector_base<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              uVar48 = 0;
              do {
                paVar37 = aiCreateAnimMesh(local_f0);
                local_f0->mAnimMeshes[uVar48] = paVar37;
                paVar37 = local_f0->mAnimMeshes[uVar48];
                plVar35 = (long *)(*(long *)&(local_e0->targets).
                                             super__Vector_base<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                                             ._M_impl.super__Vector_impl_data + uVar48 * 0x48);
                if (plVar35[1] != *plVar35) {
                  local_c8.accessor = (Accessor *)0x0;
                  glTF2::Accessor::ExtractData<aiVector3t<float>>
                            (*(Accessor **)
                              (**(long **)*plVar35 +
                              (ulong)*(uint *)((undefined8 *)*plVar35 + 1) * 8),
                             (aiVector3t<float> **)&local_c8);
                  if (local_f0->mNumVertices != 0) {
                    lVar47 = 8;
                    uVar50 = 0;
                    do {
                      paVar31 = paVar37->mVertices;
                      *(float *)((long)paVar31 + lVar47 + -8) =
                           *(float *)((long)local_c8.accessor + lVar47 + -8) +
                           *(float *)((long)paVar31 + lVar47 + -8);
                      *(float *)((long)paVar31 + lVar47 + -4) =
                           *(float *)((long)local_c8.accessor + lVar47 + -4) +
                           *(float *)((long)paVar31 + lVar47 + -4);
                      *(float *)((long)&paVar31->x + lVar47) =
                           *(float *)((long)&((local_c8.accessor)->super_Object)._vptr_Object +
                                     lVar47) + *(float *)((long)&paVar31->x + lVar47);
                      uVar50 = uVar50 + 1;
                      lVar47 = lVar47 + 0xc;
                    } while (uVar50 < local_f0->mNumVertices);
                  }
                  if (local_c8.accessor != (Accessor *)0x0) {
                    operator_delete__(local_c8.accessor);
                  }
                }
                if (plVar35[4] != plVar35[3]) {
                  local_c8.accessor = (Accessor *)0x0;
                  glTF2::Accessor::ExtractData<aiVector3t<float>>
                            (*(Accessor **)
                              (**(long **)plVar35[3] +
                              (ulong)*(uint *)((undefined8 *)plVar35[3] + 1) * 8),
                             (aiVector3t<float> **)&local_c8);
                  if (local_f0->mNumVertices != 0) {
                    lVar47 = 8;
                    uVar50 = 0;
                    do {
                      paVar31 = paVar37->mNormals;
                      *(float *)((long)paVar31 + lVar47 + -8) =
                           *(float *)((long)local_c8.accessor + lVar47 + -8) +
                           *(float *)((long)paVar31 + lVar47 + -8);
                      *(float *)((long)paVar31 + lVar47 + -4) =
                           *(float *)((long)local_c8.accessor + lVar47 + -4) +
                           *(float *)((long)paVar31 + lVar47 + -4);
                      *(float *)((long)&paVar31->x + lVar47) =
                           *(float *)((long)&((local_c8.accessor)->super_Object)._vptr_Object +
                                     lVar47) + *(float *)((long)&paVar31->x + lVar47);
                      uVar50 = uVar50 + 1;
                      lVar47 = lVar47 + 0xc;
                    } while (uVar50 < local_f0->mNumVertices);
                  }
                  if (local_c8.accessor != (Accessor *)0x0) {
                    operator_delete__(local_c8.accessor);
                  }
                }
                if (plVar35[7] != plVar35[6]) {
                  local_c8.accessor = (Accessor *)0x0;
                  puVar43 = *(undefined8 **)
                             &(local_e0->attributes).tangent.
                              super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                              ._M_impl.super__Vector_impl_data;
                  glTF2::Accessor::ExtractData<(anonymous_namespace)::Tangent>
                            (*(Accessor **)(*(long *)*puVar43 + (ulong)*(uint *)(puVar43 + 1) * 8),
                             (Tangent **)&local_c8);
                  local_88._M_dataplus._M_p = (pointer)0x0;
                  glTF2::Accessor::ExtractData<aiVector3t<float>>
                            (*(Accessor **)
                              (**(long **)plVar35[6] +
                              (ulong)*(uint *)((undefined8 *)plVar35[6] + 1) * 8),
                             (aiVector3t<float> **)&local_88);
                  if (local_f0->mNumVertices != 0) {
                    lVar47 = 0;
                    uVar50 = 0;
                    pAVar38 = local_c8.accessor;
                    do {
                      *(float *)&(pAVar38->super_Object)._vptr_Object =
                           *(float *)(local_88._M_dataplus._M_p + lVar47) +
                           *(float *)&(pAVar38->super_Object)._vptr_Object;
                      *(float *)((long)&(pAVar38->super_Object)._vptr_Object + 4) =
                           *(float *)(local_88._M_dataplus._M_p + lVar47 + 4) +
                           *(float *)((long)&(pAVar38->super_Object)._vptr_Object + 4);
                      (pAVar38->super_Object).index =
                           (int)(*(float *)(local_88._M_dataplus._M_p + lVar47 + 8) +
                                (float)(pAVar38->super_Object).index);
                      paVar31 = paVar37->mTangents;
                      *(int *)((long)&paVar31->z + lVar47) =
                           (int)*(size_t *)&(pAVar38->super_Object).index;
                      *(_func_int ***)((long)&paVar31->x + lVar47) =
                           (pAVar38->super_Object)._vptr_Object;
                      paVar31 = paVar37->mNormals;
                      paVar14 = paVar37->mBitangents;
                      fVar3 = *(float *)((long)&paVar31->x + lVar47);
                      fVar4 = *(float *)((long)&paVar31->y + lVar47);
                      fVar5 = (float)(pAVar38->super_Object).index;
                      fVar6 = *(float *)((long)&paVar31->z + lVar47);
                      fVar7 = *(float *)&(pAVar38->super_Object)._vptr_Object;
                      fVar8 = *(float *)((long)&(pAVar38->super_Object)._vptr_Object + 4);
                      fVar9 = (float)(pAVar38->super_Object).oIndex;
                      *(ulong *)((long)&paVar14->x + lVar47) =
                           CONCAT44((fVar6 * fVar7 - fVar5 * fVar3) * fVar9,
                                    (fVar4 * fVar5 - fVar8 * fVar6) * fVar9);
                      *(float *)((long)&paVar14->z + lVar47) =
                           (fVar3 * fVar8 - fVar7 * fVar4) * fVar9;
                      uVar50 = uVar50 + 1;
                      lVar47 = lVar47 + 0xc;
                      pAVar38 = (Accessor *)&(pAVar38->super_Object).id;
                    } while (uVar50 < local_f0->mNumVertices);
                  }
                  if (local_c8.accessor != (Accessor *)0x0) {
                    operator_delete__(local_c8.accessor);
                  }
                  if (local_88._M_dataplus._M_p != (pointer)0x0) {
                    operator_delete__(local_88._M_dataplus._M_p);
                  }
                }
                lVar47 = *(long *)&(local_98->weights).
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data;
                if (uVar48 < (ulong)((long)*(pointer *)
                                            ((long)&(local_98->weights).
                                                                                                        
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl + 8) - lVar47 >> 2)) {
                  paVar37->mWeight = *(float *)(lVar47 + uVar48 * 4);
                }
                uVar48 = uVar48 + 1;
                uVar50 = local_e8;
              } while (uVar48 < (ulong)(((long)*(pointer *)
                                                ((long)&(local_e0->targets).
                                                                                                                
                                                  super__Vector_base<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                                                  ._M_impl + 8) -
                                         *(long *)&(local_e0->targets).
                                                                                                      
                                                  super__Vector_base<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                                                  ._M_impl.super__Vector_impl_data >> 3) *
                                       -0x71c71c71c71c71c7));
            }
          }
          pvVar15 = (local_e0->indices).vector;
          if (pvVar15 == (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0) {
            PVar10 = local_e0->mode;
            if (PVar10 < (PrimitiveMode_TRIANGLE_FAN|PrimitiveMode_LINES)) {
              uVar24 = local_f0->mNumVertices;
              uVar48 = (ulong)uVar24;
              switch(PVar10) {
              case PrimitiveMode_POINTS:
                puVar39 = (ulong *)operator_new__(uVar48 * 0x10 + 8);
                *puVar39 = uVar48;
                paVar62 = (aiFace *)(puVar39 + 1);
                uVar50 = local_e8;
                if (uVar48 != 0) {
                  paVar40 = paVar62;
                  do {
                    paVar40->mNumIndices = 0;
                    paVar40->mIndices = (uint *)0x0;
                    paVar40 = paVar40 + 1;
                  } while (paVar40 != paVar62 + uVar48);
                  uVar57 = 0;
                  do {
                    *(undefined4 *)(puVar39 + 1) = 1;
                    puVar44 = (undefined4 *)operator_new__(4);
                    puVar39[2] = (ulong)puVar44;
                    *puVar44 = (int)uVar57;
                    uVar57 = uVar57 + 1;
                    uVar50 = local_e8;
                    puVar39 = puVar39 + 2;
                  } while (uVar48 != uVar57);
                }
                break;
              case PrimitiveMode_LINES:
                uVar50 = (ulong)(uVar24 >> 1);
                puVar39 = (ulong *)operator_new__(uVar50 * 0x10 + 8);
                *puVar39 = uVar50;
                paVar62 = (aiFace *)(puVar39 + 1);
                if (1 < uVar24) {
                  paVar40 = paVar62;
                  do {
                    paVar40->mNumIndices = 0;
                    paVar40->mIndices = (uint *)0x0;
                    paVar40 = paVar40 + 1;
                  } while (paVar40 != paVar62 + uVar50);
                }
                bVar63 = uVar48 != 0;
                uVar48 = uVar50;
                uVar50 = local_e8;
                if (bVar63) {
                  uVar59 = 0;
                  do {
                    paVar62[uVar59 >> 1].mNumIndices = 2;
                    puVar42 = (uint *)operator_new__(8);
                    paVar62[uVar59 >> 1].mIndices = puVar42;
                    *puVar42 = uVar59;
                    puVar42[1] = uVar59 + 1;
                    uVar59 = uVar59 + 2;
                    uVar50 = local_e8;
                  } while (uVar59 < uVar24);
                }
                break;
              default:
                uVar50 = (ulong)(uVar24 - (PVar10 == PrimitiveMode_LINE_STRIP));
                local_d0 = uVar50;
                puVar39 = (ulong *)operator_new__(uVar50 * 0x10 + 8);
                *puVar39 = local_d0;
                paVar62 = (aiFace *)(puVar39 + 1);
                if ((int)local_d0 != 0) {
                  paVar40 = paVar62;
                  do {
                    paVar40->mNumIndices = 0;
                    paVar40->mIndices = (uint *)0x0;
                    paVar40 = paVar40 + 1;
                  } while (paVar40 != paVar62 + uVar50);
                }
                paVar62->mNumIndices = 2;
                puVar43 = (undefined8 *)operator_new__(8);
                puVar39[2] = (ulong)puVar43;
                *puVar43 = 0x100000000;
                if (2 < uVar24) {
                  puVar55 = puVar39 + 4;
                  uVar50 = 2;
                  do {
                    uVar11 = *(undefined4 *)(puVar55[-2] + 4);
                    *(undefined4 *)(puVar55 + -1) = 2;
                    puVar44 = (undefined4 *)operator_new__(8);
                    *puVar55 = (ulong)puVar44;
                    *puVar44 = uVar11;
                    puVar44[1] = (int)uVar50;
                    uVar50 = uVar50 + 1;
                    puVar55 = puVar55 + 2;
                  } while (uVar48 != uVar50);
                }
                uVar48 = local_d0;
                uVar50 = local_e8;
                if (local_e0->mode == PrimitiveMode_LINE_LOOP) {
                  uVar59 = *(uint *)(puVar39[(ulong)(uVar24 - 2) * 2 + 2] + 4);
                  uVar27 = *(uint *)puVar39[2];
                  paVar62[uVar24 - 1].mNumIndices = 2;
                  puVar42 = (uint *)operator_new__(8);
                  paVar62[uVar24 - 1].mIndices = puVar42;
                  *puVar42 = uVar59;
                  puVar42[1] = uVar27;
                  uVar48 = local_d0;
                  uVar50 = local_e8;
                }
                break;
              case PrimitiveMode_TRIANGLES:
                uVar50 = uVar48 / 3;
                puVar39 = (ulong *)operator_new__(uVar50 * 0x10 + 8);
                *puVar39 = uVar50;
                paVar62 = (aiFace *)(puVar39 + 1);
                if (2 < uVar24) {
                  paVar40 = paVar62;
                  do {
                    paVar40->mNumIndices = 0;
                    paVar40->mIndices = (uint *)0x0;
                    paVar40 = paVar40 + 1;
                  } while (paVar40 != paVar62 + uVar50);
                }
                bVar63 = uVar48 != 0;
                uVar48 = uVar50;
                uVar50 = local_e8;
                if (bVar63) {
                  uVar59 = 0;
                  do {
                    uVar50 = (ulong)uVar59 * 0xaaaaaaab >> 0x1d & 0xfffffffffffffff0;
                    *(undefined4 *)((long)&paVar62->mNumIndices + uVar50) = 3;
                    puVar42 = (uint *)operator_new__(0xc);
                    *(uint **)((long)&paVar62->mIndices + uVar50) = puVar42;
                    *puVar42 = uVar59;
                    puVar42[1] = uVar59 + 1;
                    puVar42[2] = uVar59 + 2;
                    uVar59 = uVar59 + 3;
                    uVar50 = local_e8;
                  } while (uVar59 < uVar24);
                }
                break;
              case PrimitiveMode_TRIANGLE_STRIP:
                uVar48 = (ulong)(uVar24 - 2);
                puVar39 = (ulong *)operator_new__(uVar48 * 0x10 + 8);
                *puVar39 = uVar48;
                paVar62 = (aiFace *)(puVar39 + 1);
                uVar50 = local_e8;
                if (uVar24 - 2 != 0) {
                  paVar40 = paVar62;
                  do {
                    paVar40->mNumIndices = 0;
                    paVar40->mIndices = (uint *)0x0;
                    paVar40 = paVar40 + 1;
                  } while (paVar40 != paVar62 + uVar48);
                  uVar57 = 0;
                  do {
                    uVar58 = uVar57 + 1;
                    *(undefined4 *)(puVar39 + 1) = 3;
                    if ((uVar57 & 1) == 0) {
                      puVar44 = (undefined4 *)operator_new__(0xc);
                      uVar50 = uVar57;
                      uVar51 = uVar58;
                    }
                    else {
                      puVar44 = (undefined4 *)operator_new__(0xc);
                      uVar50 = uVar58;
                      uVar51 = uVar57;
                    }
                    puVar39[2] = (ulong)puVar44;
                    *puVar44 = (int)uVar50;
                    puVar44[1] = (int)uVar51;
                    puVar44[2] = (int)uVar57 + 2;
                    uVar57 = uVar58;
                    uVar50 = local_e8;
                    puVar39 = puVar39 + 2;
                  } while (uVar48 != uVar58);
                }
                break;
              case PrimitiveMode_TRIANGLE_FAN:
                uVar57 = (ulong)(uVar24 - 2);
                local_d0 = uVar57;
                puVar39 = (ulong *)operator_new__(uVar57 * 0x10 + 8);
                *puVar39 = local_d0;
                paVar62 = (aiFace *)(puVar39 + 1);
                if ((int)local_d0 != 0) {
                  paVar40 = paVar62;
                  do {
                    paVar40->mNumIndices = 0;
                    paVar40->mIndices = (uint *)0x0;
                    paVar40 = paVar40 + 1;
                  } while (paVar40 != paVar62 + uVar57);
                }
                paVar62->mNumIndices = 3;
                puVar43 = (undefined8 *)operator_new__(0xc);
                puVar39[2] = (ulong)puVar43;
                *puVar43 = 0x100000000;
                *(undefined4 *)(puVar43 + 1) = 2;
                uVar48 = local_d0;
                uVar50 = local_e8;
                if (1 < (uint)local_d0) {
                  lVar47 = 0x10;
                  iVar52 = 3;
                  local_a0 = paVar62;
                  do {
                    uVar11 = *(undefined4 *)puVar39[2];
                    uVar12 = *(undefined4 *)(*(long *)((long)puVar39 + lVar47) + 8);
                    *(undefined4 *)((long)puVar39 + lVar47 + 8) = 3;
                    puVar44 = (undefined4 *)operator_new__(0xc);
                    *(undefined4 **)((long)puVar39 + lVar47 + 0x10) = puVar44;
                    *puVar44 = uVar11;
                    puVar44[1] = uVar12;
                    puVar44[2] = iVar52;
                    lVar47 = lVar47 + 0x10;
                    iVar52 = iVar52 + 1;
                    uVar48 = local_d0;
                    paVar62 = local_a0;
                    uVar50 = local_e8;
                  } while (uVar57 * 0x10 != lVar47);
                }
              }
            }
            else {
              uVar48 = 0;
              paVar62 = (aiFace *)0x0;
            }
          }
          else {
            local_d8 = *(ulong *)(*(long *)(*(long *)&(pvVar15->
                                                                                                            
                                                  super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                                                  )._M_impl + (ulong)(local_e0->indices).index * 8)
                                 + 0x70);
            pAVar38 = *(Accessor **)
                       (*(long *)&(((local_e0->indices).vector)->
                                  super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                                  )._M_impl + (ulong)(local_e0->indices).index * 8);
            pvVar16 = (pAVar38->bufferView).vector;
            if (pvVar16 == (vector<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_> *)0x0)
            {
LAB_005f7a90:
              local_c8.data = (uint8_t *)0x0;
            }
            else {
              pBVar17 = (pvVar16->
                        super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>
                        )._M_impl.super__Vector_impl_data._M_start[(pAVar38->bufferView).index];
              pvVar18 = (pBVar17->buffer).vector;
              if (pvVar18 == (vector<glTF2::Buffer_*,_std::allocator<glTF2::Buffer_*>_> *)0x0)
              goto LAB_005f7a90;
              lVar47 = *(long *)(*(long *)&pvVar18->
                                           super__Vector_base<glTF2::Buffer_*,_std::allocator<glTF2::Buffer_*>_>
                                + (ulong)(pBVar17->buffer).index * 8);
              lVar19 = *(long *)(lVar47 + 0x70);
              if (lVar19 == 0) goto LAB_005f7a90;
              uVar48 = pBVar17->byteOffset + pAVar38->byteOffset;
              puVar39 = *(ulong **)(lVar47 + 0x68);
              if (puVar39 == (ulong *)0x0) {
LAB_005f82cf:
                local_c8.data = (uint8_t *)(lVar19 + uVar48);
              }
              else {
                uVar57 = *puVar39;
                bVar63 = true;
                local_c8.data = (uint8_t *)(uVar48 - uVar57);
                if ((uVar57 <= uVar48) && (uVar48 < uVar57 + puVar39[3])) {
                  local_c8.data = local_c8.data + puVar39[2];
                  bVar63 = false;
                }
                if (bVar63) goto LAB_005f82cf;
              }
            }
            iVar52 = *(int *)(&DAT_008cf328 + (ulong)pAVar38->type * 0x10);
            local_c8.accessor = pAVar38;
            uVar24 = glTF2::ComponentTypeSize(pAVar38->componentType);
            uVar57 = local_d8;
            local_c8.elemSize = (size_t)(uVar24 * iVar52);
            pvVar16 = (pAVar38->bufferView).vector;
            local_c8.stride = local_c8.elemSize;
            if ((pvVar16 != (vector<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_> *)0x0
                ) && (pp_Var49 = (_func_int **)
                                 (ulong)(pvVar16->
                                        super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start
                                        [(pAVar38->bufferView).index]->byteStride,
                     pp_Var49 != (_func_int **)0x0)) {
              local_c8.stride = (size_t)pp_Var49;
            }
            if (local_c8.data == (uint8_t *)0x0) {
              __assert_fail("data.IsValid()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/glTF2/glTF2Importer.cpp"
                            ,0x207,"void Assimp::glTF2Importer::ImportMeshes(glTF2::Asset &)");
            }
            switch(local_e0->mode) {
            case PrimitiveMode_POINTS:
              uVar48 = local_d8 * 0x10 + 8;
              if (0xfffffffffffffff < local_d8) {
                uVar48 = 0xffffffffffffffff;
              }
              puVar39 = (ulong *)operator_new__(uVar48);
              uVar48 = local_d8;
              *puVar39 = local_d8;
              paVar62 = (aiFace *)(puVar39 + 1);
              if (local_d8 != 0) {
                paVar40 = paVar62;
                do {
                  paVar40->mNumIndices = 0;
                  paVar40->mIndices = (uint *)0x0;
                  paVar40 = paVar40 + 1;
                } while (paVar40 != paVar62 + uVar57);
                uVar24 = 1;
                uVar57 = 0;
                do {
                  uVar59 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_c8,uVar24 - 1);
                  paVar62[uVar57].mNumIndices = 1;
                  puVar42 = (uint *)operator_new__(4);
                  paVar62[uVar57].mIndices = puVar42;
                  *puVar42 = uVar59;
                  uVar57 = (ulong)uVar24;
                  uVar24 = uVar24 + 1;
                  uVar50 = local_e8;
                } while (uVar57 < uVar48);
              }
              break;
            case PrimitiveMode_LINES:
              uVar50 = local_d8 >> 1;
              local_d0 = uVar50;
              puVar39 = (ulong *)operator_new__(-(ulong)(local_d8 >> 0x3d != 0) | uVar50 * 0x10 | 8)
              ;
              *puVar39 = local_d0;
              paVar62 = (aiFace *)(puVar39 + 1);
              if (1 < local_d8) {
                paVar40 = paVar62;
                do {
                  paVar40->mNumIndices = 0;
                  paVar40->mIndices = (uint *)0x0;
                  paVar40 = paVar40 + 1;
                } while (paVar40 != paVar62 + uVar50);
              }
              uVar48 = local_d0;
              uVar50 = local_e8;
              if (local_d8 != 0) {
                uVar24 = 2;
                do {
                  uVar25 = uVar24 - 2 >> 1;
                  uVar59 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_c8,uVar24 - 2);
                  uVar27 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_c8,uVar24 - 1);
                  paVar62[uVar25].mNumIndices = 2;
                  puVar42 = (uint *)operator_new__(8);
                  paVar62[uVar25].mIndices = puVar42;
                  *puVar42 = uVar59;
                  puVar42[1] = uVar27;
                  uVar57 = (ulong)uVar24;
                  uVar24 = uVar24 + 2;
                  uVar48 = local_d0;
                  uVar50 = local_e8;
                } while (uVar57 < local_d8);
              }
              break;
            case PrimitiveMode_LINE_LOOP:
            case PrimitiveMode_LINE_STRIP:
              uVar48 = local_d8 - (local_e0->mode == PrimitiveMode_LINE_STRIP);
              uVar50 = uVar48 * 0x10 + 8;
              if (0xfffffffffffffff < uVar48) {
                uVar50 = 0xffffffffffffffff;
              }
              local_d0 = uVar48;
              puVar39 = (ulong *)operator_new__(uVar50);
              *puVar39 = local_d0;
              paVar62 = (aiFace *)(puVar39 + 1);
              if (local_d0 != 0) {
                paVar40 = paVar62;
                do {
                  paVar40->mNumIndices = 0;
                  paVar40->mIndices = (uint *)0x0;
                  paVar40 = paVar40 + 1;
                } while (paVar40 != paVar62 + uVar48);
              }
              uVar24 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_c8,0);
              uVar59 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_c8,1);
              paVar62->mNumIndices = 2;
              puVar42 = (uint *)operator_new__(8);
              puVar39[2] = (ulong)puVar42;
              *puVar42 = uVar24;
              puVar42[1] = uVar59;
              if (2 < local_d8) {
                uVar24 = 3;
                do {
                  uVar59 = *(uint *)(puVar39[(ulong)(uVar24 - 3) * 2 + 2] + 4);
                  uVar27 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_c8,uVar24 - 1);
                  paVar62[uVar24 - 2].mNumIndices = 2;
                  puVar42 = (uint *)operator_new__(8);
                  paVar62[uVar24 - 2].mIndices = puVar42;
                  *puVar42 = uVar59;
                  puVar42[1] = uVar27;
                  uVar50 = (ulong)uVar24;
                  uVar24 = uVar24 + 1;
                } while (uVar50 < local_d8);
              }
              uVar57 = local_d8;
              uVar48 = local_d0;
              uVar50 = local_e8;
              if (local_e0->mode == PrimitiveMode_LINE_LOOP) {
                uVar24 = *(uint *)(puVar39[local_d8 * 2 + -2] + 4);
                uVar59 = *(uint *)puVar39[2];
                *(undefined4 *)(puVar39 + local_d8 * 2 + -1) = 2;
                puVar42 = (uint *)operator_new__(8);
                paVar62[uVar57 - 1].mIndices = puVar42;
                *puVar42 = uVar24;
                puVar42[1] = uVar59;
                uVar48 = local_d0;
                uVar50 = local_e8;
              }
              break;
            case PrimitiveMode_TRIANGLES:
              uVar57 = local_d8 / 3;
              uVar48 = uVar57 * 0x10 + 8;
              if (2 < (uint)(local_d8 >> 0x3c)) {
                uVar48 = 0xffffffffffffffff;
              }
              local_d0 = uVar57;
              puVar39 = (ulong *)operator_new__(uVar48);
              *puVar39 = local_d0;
              paVar62 = (aiFace *)(puVar39 + 1);
              if (2 < local_d8) {
                paVar40 = paVar62;
                do {
                  paVar40->mNumIndices = 0;
                  paVar40->mIndices = (uint *)0x0;
                  paVar40 = paVar40 + 1;
                } while (paVar40 != paVar62 + uVar57);
              }
              uVar48 = local_d0;
              if (local_d8 != 0) {
                uVar24 = 0;
                local_a0 = paVar62;
                do {
                  uVar50 = (ulong)uVar24 * 0xaaaaaaab >> 0x1d & 0xfffffffffffffff0;
                  uVar59 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_c8,uVar24);
                  uVar27 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_c8,uVar24 + 1);
                  uVar25 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_c8,uVar24 + 2);
                  *(undefined4 *)((long)&local_a0->mNumIndices + uVar50) = 3;
                  puVar42 = (uint *)operator_new__(0xc);
                  *(uint **)((long)&local_a0->mIndices + uVar50) = puVar42;
                  *puVar42 = uVar59;
                  puVar42[1] = uVar27;
                  puVar42[2] = uVar25;
                  uVar59 = uVar24 + 3;
                  uVar24 = uVar24 + 3;
                  uVar48 = local_d0;
                  paVar62 = local_a0;
                  uVar50 = local_e8;
                } while (uVar59 < local_d8);
              }
              break;
            case PrimitiveMode_TRIANGLE_STRIP:
              uVar57 = local_d8 - 2;
              uVar48 = uVar57 * 0x10 + 8;
              if (0xfffffffffffffff < uVar57) {
                uVar48 = 0xffffffffffffffff;
              }
              local_d8 = uVar57;
              puVar39 = (ulong *)operator_new__(uVar48);
              *puVar39 = local_d8;
              paVar62 = (aiFace *)(puVar39 + 1);
              uVar48 = local_d8;
              if (local_d8 != 0) {
                paVar40 = paVar62;
                do {
                  paVar40->mNumIndices = 0;
                  paVar40->mIndices = (uint *)0x0;
                  paVar40 = paVar40 + 1;
                } while (paVar40 != paVar62 + uVar57);
                uVar57 = 0;
                uVar24 = 1;
                local_a0 = paVar62;
                do {
                  uVar27 = uVar24 - 1;
                  paVar62 = local_a0 + uVar57;
                  uVar59 = uVar24 + 1;
                  if ((uVar27 & 1) == 0) {
                    uVar25 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_c8,uVar27);
                    uVar27 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_c8,uVar24);
                    uVar26 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_c8,uVar59);
                    paVar62->mNumIndices = 3;
                    puVar42 = (uint *)operator_new__(0xc);
                  }
                  else {
                    uVar25 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_c8,uVar24);
                    uVar27 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_c8,uVar27);
                    uVar26 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_c8,uVar59);
                    paVar62->mNumIndices = 3;
                    puVar42 = (uint *)operator_new__(0xc);
                  }
                  paVar62->mIndices = puVar42;
                  *puVar42 = uVar25;
                  puVar42[1] = uVar27;
                  puVar42[2] = uVar26;
                  uVar57 = (ulong)uVar24;
                  uVar48 = local_d8;
                  paVar62 = local_a0;
                  uVar50 = local_e8;
                  uVar24 = uVar59;
                } while (uVar57 < local_d8);
              }
              break;
            case PrimitiveMode_TRIANGLE_FAN:
              uVar48 = local_d8 - 2;
              uVar50 = uVar48 * 0x10 + 8;
              if (0xfffffffffffffff < uVar48) {
                uVar50 = 0xffffffffffffffff;
              }
              local_d8 = uVar48;
              paVar40 = (aiFace *)operator_new__(uVar50);
              *(ulong *)paVar40 = local_d8;
              paVar62 = (aiFace *)&paVar40->mIndices;
              if (local_d8 != 0) {
                ppuVar41 = (uint **)paVar62;
                do {
                  *(undefined4 *)ppuVar41 = 0;
                  ppuVar41[1] = (uint *)0x0;
                  ppuVar41 = ppuVar41 + 2;
                } while (ppuVar41 != (uint **)((long)paVar62 + uVar48 * 2 * 8));
              }
              uVar24 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_c8,0);
              uVar59 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_c8,1);
              uVar27 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_c8,2);
              *(undefined4 *)paVar62 = 3;
              puVar42 = (uint *)operator_new__(0xc);
              *(uint **)(paVar40 + 1) = puVar42;
              *puVar42 = uVar24;
              puVar42[1] = uVar59;
              puVar42[2] = uVar27;
              uVar48 = local_d8;
              uVar50 = local_e8;
              if (1 < local_d8) {
                uVar57 = 1;
                iVar52 = 3;
                local_a0 = paVar40;
                do {
                  uVar24 = **(uint **)(local_a0 + 1);
                  uVar59 = *(uint *)(*(ulong *)(paVar40 + (ulong)(iVar52 - 3) + 1) + 8);
                  uVar27 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_c8,iVar52);
                  *(undefined4 *)((long)paVar62 + uVar57 * 2 * 8) = 3;
                  puVar42 = (uint *)operator_new__(0xc);
                  *(uint **)((long)paVar62 + (uVar57 * 2 + 1) * 8) = puVar42;
                  *puVar42 = uVar24;
                  puVar42[1] = uVar59;
                  puVar42[2] = uVar27;
                  uVar57 = (ulong)(iVar52 - 1);
                  iVar52 = iVar52 + 1;
                  uVar48 = local_d8;
                  uVar50 = local_e8;
                } while (uVar57 < local_d8);
              }
              break;
            default:
              uVar48 = 0;
              paVar62 = (aiFace *)0x0;
            }
          }
          if (paVar62 != (aiFace *)0x0) {
            local_f0->mFaces = paVar62;
            local_f0->mNumFaces = (uint)uVar48;
            bVar63 = (uint)uVar48 == 0;
            if (!bVar63) {
              uVar57 = 0;
              bVar63 = false;
              do {
                uVar58 = (ulong)paVar62[uVar57].mNumIndices;
                if (uVar58 != 0) {
                  if (local_f0->mNumVertices <= *paVar62[uVar57].mIndices) break;
                  uVar51 = 0;
                  do {
                    if (uVar58 - 1 == uVar51) goto LAB_005f868a;
                    uVar1 = uVar51 + 1;
                    lVar47 = uVar51 + 1;
                    uVar51 = uVar1;
                  } while (paVar62[uVar57].mIndices[lVar47] < local_f0->mNumVertices);
                  if (uVar1 < uVar58) break;
                }
LAB_005f868a:
                uVar57 = uVar57 + 1;
                bVar63 = (uVar48 & 0xffffffff) <= uVar57;
              } while (uVar57 != (uVar48 & 0xffffffff));
            }
            if (!bVar63) {
              __assert_fail("CheckValidFacesIndices(faces, static_cast<unsigned>(nFaces), aim->mNumVertices)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/glTF2/glTF2Importer.cpp"
                            ,0x29c,"void Assimp::glTF2Importer::ImportMeshes(glTF2::Asset &)");
            }
          }
          if ((local_e0->material).vector ==
              (vector<glTF2::Material_*,_std::allocator<glTF2::Material_*>_> *)0x0) {
            uVar24 = local_90->mScene->mNumMaterials - 1;
          }
          else {
            uVar24 = (local_e0->material).index;
          }
          local_f0->mMaterialIndex = uVar24;
          local_f8 = (ulong)(iVar46 + 1);
          pPVar61 = (local_98->primitives).
                    super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (local_f8 <
                 (ulong)((long)*(pointer *)
                                ((long)&(local_98->primitives).
                                        super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                                        ._M_impl + 8) - (long)pPVar61 >> 8));
      }
      uVar50 = uVar50 + 1;
      ppMVar28 = (local_40->meshes).mObjs.
                 super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar50 < ((ulong)((long)(local_40->meshes).mObjs.
                                     super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar28) >>
                       3 & 0xffffffff));
  }
  pgVar22 = local_90;
  iVar13._M_current =
       (local_90->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar13._M_current ==
      (local_90->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_90->meshOffsets,iVar13,
               &local_a4);
  }
  else {
    *iVar13._M_current = local_a4;
    ppuVar2 = &(local_90->meshOffsets).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar2 = *ppuVar2 + 1;
  }
  iVar23._M_current = iStack_60._M_current;
  ppaVar56 = local_68;
  paVar20 = pgVar22->mScene;
  uVar24 = (uint)((ulong)((long)iStack_60._M_current - (long)local_68) >> 3);
  paVar20->mNumMeshes = uVar24;
  if (uVar24 != 0) {
    ppaVar45 = (aiMesh **)operator_new__((long)iStack_60._M_current - (long)local_68 & 0x7fffffff8);
    paVar20->mMeshes = ppaVar45;
    for (; ppaVar56 != iVar23._M_current; ppaVar56 = ppaVar56 + 1) {
      paVar29 = *ppaVar56;
      *ppaVar56 = *ppaVar45;
      *ppaVar45 = paVar29;
      ppaVar45 = ppaVar45 + 1;
    }
  }
  if (local_68 != (aiMesh **)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  return;
}

Assistant:

void glTF2Importer::ImportMeshes(glTF2::Asset& r)
{
    std::vector<aiMesh*> meshes;

    unsigned int k = 0;

    for (unsigned int m = 0; m < r.meshes.Size(); ++m) {
        Mesh& mesh = r.meshes[m];

        meshOffsets.push_back(k);
        k += unsigned(mesh.primitives.size());

        for (unsigned int p = 0; p < mesh.primitives.size(); ++p) {
            Mesh::Primitive& prim = mesh.primitives[p];

            aiMesh* aim = new aiMesh();
            meshes.push_back(aim);

            aim->mName = mesh.name.empty() ? mesh.id : mesh.name;

            if (mesh.primitives.size() > 1) {
                ai_uint32& len = aim->mName.length;
                aim->mName.data[len] = '-';
                len += 1 + ASSIMP_itoa10(aim->mName.data + len + 1, unsigned(MAXLEN - len - 1), p);
            }

            switch (prim.mode) {
                case PrimitiveMode_POINTS:
                    aim->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;

                case PrimitiveMode_LINES:
                case PrimitiveMode_LINE_LOOP:
                case PrimitiveMode_LINE_STRIP:
                    aim->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;

                case PrimitiveMode_TRIANGLES:
                case PrimitiveMode_TRIANGLE_STRIP:
                case PrimitiveMode_TRIANGLE_FAN:
                    aim->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;

            }

            Mesh::Primitive::Attributes& attr = prim.attributes;

            if (attr.position.size() > 0 && attr.position[0]) {
                aim->mNumVertices = static_cast<unsigned int>(attr.position[0]->count);
                attr.position[0]->ExtractData(aim->mVertices);
            }

            if (attr.normal.size() > 0 && attr.normal[0]) {
                attr.normal[0]->ExtractData(aim->mNormals);

                // only extract tangents if normals are present
                if (attr.tangent.size() > 0 && attr.tangent[0]) {
                    // generate bitangents from normals and tangents according to spec
                    Tangent *tangents = nullptr;

                    attr.tangent[0]->ExtractData(tangents);

                    aim->mTangents = new aiVector3D[aim->mNumVertices];
                    aim->mBitangents = new aiVector3D[aim->mNumVertices];

                    for (unsigned int i = 0; i < aim->mNumVertices; ++i) {
                        aim->mTangents[i] = tangents[i].xyz;
                        aim->mBitangents[i] = (aim->mNormals[i] ^ tangents[i].xyz) * tangents[i].w;
                    }

                    delete [] tangents;
                }
            }

            for (size_t c = 0; c < attr.color.size() && c < AI_MAX_NUMBER_OF_COLOR_SETS; ++c) {
                if (attr.color[c]->count != aim->mNumVertices) {
                    DefaultLogger::get()->warn("Color stream size in mesh \"" + mesh.name +
                        "\" does not match the vertex count");
                    continue;
                }
                attr.color[c]->ExtractData(aim->mColors[c]);
            }
            for (size_t tc = 0; tc < attr.texcoord.size() && tc < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++tc) {
                if (attr.texcoord[tc]->count != aim->mNumVertices) {
                    DefaultLogger::get()->warn("Texcoord stream size in mesh \"" + mesh.name +
                                               "\" does not match the vertex count");
                    continue;
                }

                attr.texcoord[tc]->ExtractData(aim->mTextureCoords[tc]);
                aim->mNumUVComponents[tc] = attr.texcoord[tc]->GetNumComponents();

                aiVector3D* values = aim->mTextureCoords[tc];
                for (unsigned int i = 0; i < aim->mNumVertices; ++i) {
                    values[i].y = 1 - values[i].y; // Flip Y coords
                }
            }

            std::vector<Mesh::Primitive::Target>& targets = prim.targets;
            if (targets.size() > 0) {
                aim->mNumAnimMeshes = (unsigned int)targets.size();
                aim->mAnimMeshes = new aiAnimMesh*[aim->mNumAnimMeshes];
                for (size_t i = 0; i < targets.size(); i++) {
                    aim->mAnimMeshes[i] = aiCreateAnimMesh(aim);
                    aiAnimMesh& aiAnimMesh = *(aim->mAnimMeshes[i]);
                    Mesh::Primitive::Target& target = targets[i];

                    if (target.position.size() > 0) {
                        aiVector3D *positionDiff = nullptr;
                        target.position[0]->ExtractData(positionDiff);
                        for(unsigned int vertexId = 0; vertexId < aim->mNumVertices; vertexId++) {
                            aiAnimMesh.mVertices[vertexId] += positionDiff[vertexId];
                        }
                        delete [] positionDiff;
                    }
                    if (target.normal.size() > 0) {
                        aiVector3D *normalDiff = nullptr;
                        target.normal[0]->ExtractData(normalDiff);
                        for(unsigned int vertexId = 0; vertexId < aim->mNumVertices; vertexId++) {
                            aiAnimMesh.mNormals[vertexId] += normalDiff[vertexId];
                        }
                        delete [] normalDiff;
                    }
                    if (target.tangent.size() > 0) {
                        Tangent *tangent = nullptr;
                        attr.tangent[0]->ExtractData(tangent);

                        aiVector3D *tangentDiff = nullptr;
                        target.tangent[0]->ExtractData(tangentDiff);

                        for (unsigned int vertexId = 0; vertexId < aim->mNumVertices; ++vertexId) {
                            tangent[vertexId].xyz += tangentDiff[vertexId];
                            aiAnimMesh.mTangents[vertexId] = tangent[vertexId].xyz;
                            aiAnimMesh.mBitangents[vertexId] = (aiAnimMesh.mNormals[vertexId] ^ tangent[vertexId].xyz) * tangent[vertexId].w;
                        }
                        delete [] tangent;
                        delete [] tangentDiff;
                    }
                    if (mesh.weights.size() > i) {
                        aiAnimMesh.mWeight = mesh.weights[i];
                    }
                }
            }


            aiFace* faces = 0;
            size_t nFaces = 0;

            if (prim.indices) {
                size_t count = prim.indices->count;

                Accessor::Indexer data = prim.indices->GetIndexer();
                ai_assert(data.IsValid());

                switch (prim.mode) {
                    case PrimitiveMode_POINTS: {
                        nFaces = count;
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < count; ++i) {
                            SetFace(faces[i], data.GetUInt(i));
                        }
                        break;
                    }

                    case PrimitiveMode_LINES: {
                        nFaces = count / 2;
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < count; i += 2) {
                            SetFace(faces[i / 2], data.GetUInt(i), data.GetUInt(i + 1));
                        }
                        break;
                    }

                    case PrimitiveMode_LINE_LOOP:
                    case PrimitiveMode_LINE_STRIP: {
                        nFaces = count - ((prim.mode == PrimitiveMode_LINE_STRIP) ? 1 : 0);
                        faces = new aiFace[nFaces];
                        SetFace(faces[0], data.GetUInt(0), data.GetUInt(1));
                        for (unsigned int i = 2; i < count; ++i) {
                            SetFace(faces[i - 1], faces[i - 2].mIndices[1], data.GetUInt(i));
                        }
                        if (prim.mode == PrimitiveMode_LINE_LOOP) { // close the loop
                            SetFace(faces[count - 1], faces[count - 2].mIndices[1], faces[0].mIndices[0]);
                        }
                        break;
                    }

                    case PrimitiveMode_TRIANGLES: {
                        nFaces = count / 3;
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < count; i += 3) {
                            SetFace(faces[i / 3], data.GetUInt(i), data.GetUInt(i + 1), data.GetUInt(i + 2));
                        }
                        break;
                    }
                    case PrimitiveMode_TRIANGLE_STRIP: {
                        nFaces = count - 2;
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < nFaces; ++i) {
                            //The ordering is to ensure that the triangles are all drawn with the same orientation
                            if ((i + 1) % 2 == 0)
                            {
                                //For even n, vertices n + 1, n, and n + 2 define triangle n
                                SetFace(faces[i], data.GetUInt(i + 1), data.GetUInt(i), data.GetUInt(i + 2));
                            }
                            else
                            {
                                //For odd n, vertices n, n+1, and n+2 define triangle n
                                SetFace(faces[i], data.GetUInt(i), data.GetUInt(i + 1), data.GetUInt(i + 2));
                            }
                        }
                        break;
                    }
                    case PrimitiveMode_TRIANGLE_FAN:
                        nFaces = count - 2;
                        faces = new aiFace[nFaces];
                        SetFace(faces[0], data.GetUInt(0), data.GetUInt(1), data.GetUInt(2));
                        for (unsigned int i = 1; i < nFaces; ++i) {
                            SetFace(faces[i], faces[0].mIndices[0], faces[i - 1].mIndices[2], data.GetUInt(i + 2));
                        }
                        break;
                }
            }
            else { // no indices provided so directly generate from counts

                // use the already determined count as it includes checks
                unsigned int count = aim->mNumVertices;

                switch (prim.mode) {
                case PrimitiveMode_POINTS: {
                    nFaces = count;
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < count; ++i) {
                        SetFace(faces[i], i);
                    }
                    break;
                }

                case PrimitiveMode_LINES: {
                    nFaces = count / 2;
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < count; i += 2) {
                        SetFace(faces[i / 2], i, i + 1);
                    }
                    break;
                }

                case PrimitiveMode_LINE_LOOP:
                case PrimitiveMode_LINE_STRIP: {
                    nFaces = count - ((prim.mode == PrimitiveMode_LINE_STRIP) ? 1 : 0);
                    faces = new aiFace[nFaces];
                    SetFace(faces[0], 0, 1);
                    for (unsigned int i = 2; i < count; ++i) {
                        SetFace(faces[i - 1], faces[i - 2].mIndices[1], i);
                    }
                    if (prim.mode == PrimitiveMode_LINE_LOOP) { // close the loop
                        SetFace(faces[count - 1], faces[count - 2].mIndices[1], faces[0].mIndices[0]);
                    }
                    break;
                }

                case PrimitiveMode_TRIANGLES: {
                    nFaces = count / 3;
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < count; i += 3) {
                        SetFace(faces[i / 3], i, i + 1, i + 2);
                    }
                    break;
                }
                case PrimitiveMode_TRIANGLE_STRIP: {
                    nFaces = count - 2;
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < nFaces; ++i) {
                        //The ordering is to ensure that the triangles are all drawn with the same orientation
                        if ((i+1) % 2 == 0)
                        {
                            //For even n, vertices n + 1, n, and n + 2 define triangle n
                            SetFace(faces[i], i+1, i, i+2);
                        }
                        else
                        {
                            //For odd n, vertices n, n+1, and n+2 define triangle n
                            SetFace(faces[i], i, i+1, i+2);
                        }
                    }
                    break;
                }
                case PrimitiveMode_TRIANGLE_FAN:
                    nFaces = count - 2;
                    faces = new aiFace[nFaces];
                    SetFace(faces[0], 0, 1, 2);
                    for (unsigned int i = 1; i < nFaces; ++i) {
                        SetFace(faces[i], faces[0].mIndices[0], faces[i - 1].mIndices[2], i + 2);
                    }
                    break;
                }
            }

            if (faces) {
                aim->mFaces = faces;
                aim->mNumFaces = static_cast<unsigned int>(nFaces);
                ai_assert(CheckValidFacesIndices(faces, static_cast<unsigned>(nFaces), aim->mNumVertices));
            }

            if (prim.material) {
                aim->mMaterialIndex = prim.material.GetIndex();
            }
            else {
                aim->mMaterialIndex = mScene->mNumMaterials - 1;
            }

        }
    }

    meshOffsets.push_back(k);

    CopyVector(meshes, mScene->mMeshes, mScene->mNumMeshes);
}